

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscPStackEntry.cpp
# Opt level: O0

void __thiscall CNscPStackEntry::~CNscPStackEntry(CNscPStackEntry *this)

{
  void *pvVar1;
  long in_RDI;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffe0;
  
  if (*(long *)(in_RDI + 0x18) != 0) {
    if ((*(int *)(*(long *)(in_RDI + 0x18) + 0x10) == 2) &&
       (pvVar1 = *(void **)(*(long *)(in_RDI + 0x18) + 0x30), pvVar1 != (void *)0x0)) {
      std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffffe0);
      operator_delete(pvVar1);
    }
    if (*(void **)(in_RDI + 0x18) != (void *)0x0) {
      operator_delete(*(void **)(in_RDI + 0x18));
    }
  }
  if ((*(long *)(in_RDI + 0x70) != in_RDI + 0x88) && (*(void **)(in_RDI + 0x70) != (void *)0x0)) {
    operator_delete__(*(void **)(in_RDI + 0x70));
  }
  if ((*(long *)(in_RDI + 0x20) != in_RDI + 0x30) && (*(void **)(in_RDI + 0x20) != (void *)0x0)) {
    operator_delete__(*(void **)(in_RDI + 0x20));
  }
  CNwnDoubleLinkList::~CNwnDoubleLinkList((CNwnDoubleLinkList *)0x209a88);
  return;
}

Assistant:

CNscPStackEntry::~CNscPStackEntry ()
{

	//
	// Delete any of our allocated variables
	//

	if (m_pFence)
	{
		if (m_pFence ->nFenceType == NscFenceType_Switch)
			delete m_pFence ->pSwitchCasesUsed;
		delete m_pFence;
	}
	if (m_pauchData != m_auchDataFast)
		delete [] m_pauchData;
	if (m_pszId != m_achIdFast)
		delete [] m_pszId;
}